

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

int __thiscall luna::CodeGenerateVisitor::PrepareUpvalue(CodeGenerateVisitor *this,String *name)

{
  Function *pFVar1;
  GenerateFunction *function;
  String *pSVar2;
  int iVar3;
  int iVar4;
  _Elt_pointer ppGVar5;
  LocalNameInfo *pLVar6;
  CodeGenerateException *pCVar7;
  bool parent_local;
  anon_union_16_2_eed97686_for_String_2 *paVar8;
  _Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_> local_88;
  Function *local_38;
  
  pFVar1 = this->current_function_->function_;
  iVar3 = Function::SearchUpvalue(pFVar1,name);
  if (iVar3 < 0) {
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>::
    _M_initialize_map(&local_88,0);
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>>::
      _M_push_back_aux<luna::GenerateFunction*const&>
                ((deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>> *)&local_88
                 ,&this->current_function_->parent_);
    }
    else {
      *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = this->current_function_->parent_;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    local_38 = pFVar1;
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      iVar3 = -1;
      parent_local = false;
    }
    else {
      iVar3 = -1;
      parent_local = false;
      do {
        ppGVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppGVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        function = ppGVar5[-1];
        if (function == (GenerateFunction *)0x0) {
          __assert_fail("current",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                        ,0x157,"int luna::CodeGenerateVisitor::PrepareUpvalue(String *) const");
        }
        if (iVar3 < 0) {
          pLVar6 = SearchFunctionLocalName(this,function,name);
          if (pLVar6 == (LocalNameInfo *)0x0) {
            iVar4 = Function::SearchUpvalue(function->function_,name);
            if (-1 < iVar4) goto LAB_00163787;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>>::
              _M_push_back_aux<luna::GenerateFunction*const&>
                        ((deque<luna::GenerateFunction*,std::allocator<luna::GenerateFunction*>> *)
                         &local_88,&function->parent_);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = function->parent_;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
          else {
            iVar3 = pLVar6->register_id_;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            parent_local = true;
          }
        }
        else {
          iVar4 = Function::AddUpvalue(function->function_,name,parent_local,iVar3);
          if (0xf9 < iVar4) {
            pCVar7 = (CodeGenerateException *)__cxa_allocate_exception(0x20);
            pSVar2 = function->function_->module_;
            if ((pSVar2->super_GCObject).field_0x11 == '\0') {
              paVar8 = &pSVar2->field_1;
            }
            else {
              paVar8 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar2->field_1).str_;
            }
            CodeGenerateException::CodeGenerateException<char_const(&)[30]>
                      (pCVar7,paVar8->str_buffer_,function->function_->line_,
                       (char (*) [30])"too many upvalues in function");
            __cxa_throw(pCVar7,&CodeGenerateException::typeinfo,Exception::~Exception);
          }
LAB_00163787:
          iVar3 = iVar4;
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          parent_local = false;
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    pFVar1 = local_38;
    if (iVar3 < 0) {
      __assert_fail("register_index >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                    ,0x184,"int luna::CodeGenerateVisitor::PrepareUpvalue(String *) const");
    }
    iVar3 = Function::AddUpvalue(local_38,name,parent_local,iVar3);
    if (0xf9 < iVar3) {
      pCVar7 = (CodeGenerateException *)__cxa_allocate_exception(0x20);
      pSVar2 = pFVar1->module_;
      if ((pSVar2->super_GCObject).field_0x11 == '\0') {
        paVar8 = &pSVar2->field_1;
      }
      else {
        paVar8 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar2->field_1).str_;
      }
      CodeGenerateException::CodeGenerateException<char_const(&)[30]>
                (pCVar7,paVar8->str_buffer_,local_38->line_,
                 (char (*) [30])"too many upvalues in function");
      __cxa_throw(pCVar7,&CodeGenerateException::typeinfo,Exception::~Exception);
    }
    std::_Deque_base<luna::GenerateFunction_*,_std::allocator<luna::GenerateFunction_*>_>::
    ~_Deque_base(&local_88);
  }
  return iVar3;
}

Assistant:

int PrepareUpvalue(String *name) const
        {
            // If the upvalue info existed, then return the index of the upvalue
            auto function = GetCurrentFunction();
            auto index = function->SearchUpvalue(name);
            if (index >= 0)
                return index;

            // Search start from parent
            std::stack<GenerateFunction *> parents;
            parents.push(current_function_->parent_);

            int register_index = -1;
            bool parent_local = false;
            while (!parents.empty())
            {
                auto current = parents.top();
                assert(current);
                if (register_index >= 0)
                {
                    // Find it, add it as upvalue to function,
                    // and continue backtrack
                    auto index = current->function_->AddUpvalue(name, parent_local,
                                                                register_index);
                    CHECK_UPVALUE_MAX_COUNT(index, current->function_);
                    register_index = index;
                    parent_local = false;
                    parents.pop();
                }
                else
                {
                    // Find name from local names
                    auto name_info = SearchFunctionLocalName(current, name);
                    if (name_info)
                    {
                        // Find it, get its register_id and start backtrack
                        register_index = name_info->register_id_;
                        parent_local = true;
                        parents.pop();
                    }
                    else
                    {
                        // Find it from current function upvalue list
                        auto index = current->function_->SearchUpvalue(name);
                        if (index >= 0)
                        {
                            // Find it, the name upvalue has been inserted,
                            // then get the upvalue index, and start backtrack
                            register_index = index;
                            parent_local = false;
                            parents.pop();
                        }
                        else
                        {
                            // Not find it, continue to search its parent
                            parents.push(current->parent_);
                        }
                    }
                }
            }

            // Add it as upvalue to current function
            assert(register_index >= 0);
            index = function->AddUpvalue(name, parent_local, register_index);
            CHECK_UPVALUE_MAX_COUNT(index, function);
            return index;
        }